

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long *in_RSI;
  long lVar6;
  long *in_RDI;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  __m128 _p_7;
  __m128 _b_2;
  __m128 _a_2;
  int i_10;
  float *ptr_4;
  float b_2;
  float a_2;
  int q_3;
  float *beta_2;
  float *gamma_2;
  float scale2_2;
  float scale1_2;
  float tmp_2;
  __m128 _p_6;
  __m128 _mean_2;
  __m128 _sqsum_2;
  int i_9;
  float *ptr_3;
  int q_2;
  float sqsum_2;
  float mean_2;
  __m128 _sum_2;
  int i_8;
  float *ptr_2;
  int q_1;
  float sum_2;
  Mat beta_data_g_2;
  Mat gamma_data_g_2;
  Mat bottom_top_blob_g_2;
  int g_2;
  int size_1;
  int d;
  int h;
  int w_1;
  __m128 _p_5;
  __m128 _scale2_2;
  __m128 _scale1_2;
  int i_7;
  __m128 _p_4;
  __m128 _b_1;
  __m128 _a_1;
  int i_6;
  float b_1;
  float a_1;
  int q;
  float *beta_1;
  float *gamma_1;
  float scale2_1;
  float scale1_1;
  float tmp_1;
  __m128 _p_3;
  __m128 _mean_1;
  __m128 _sqsum_1;
  int i_5;
  float sqsum_1;
  float mean_1;
  __m128 _sum_1;
  int i_4;
  float *ptr_1;
  float sum_1;
  Mat beta_data_g_1;
  Mat gamma_data_g_1;
  Mat bottom_top_blob_g_1;
  int g_1;
  int size;
  int w;
  __m128 _p_2;
  __m128 _scale2_1;
  __m128 _scale1_1;
  int i_3;
  float b;
  float a;
  __m128 _b;
  __m128 _a;
  __m128 _p_1;
  __m128 _beta;
  __m128 _gamma;
  __m128 _scale2;
  __m128 _scale1;
  float *beta;
  float *gamma;
  int i_2;
  float scale2;
  float scale1;
  float tmp;
  __m128 _p;
  __m128 _mean;
  __m128 _sqsum;
  int i_1;
  float sqsum;
  float mean;
  __m128 _sum;
  int i;
  float *ptr;
  float sum;
  Mat beta_data_g;
  Mat gamma_data_g;
  Mat bottom_top_blob_g;
  int g;
  int channels_per_group;
  int dims;
  __m128 x32_5;
  __m128 x64_5;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x32_2;
  __m128 x64_2;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x32;
  __m128 x64;
  Mat *m;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_199c;
  float *local_1950;
  float local_1944;
  float local_1940;
  int local_193c;
  float *local_1938;
  float *local_1930;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  int local_18dc;
  float *local_1890;
  int local_1884;
  float local_1880;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  int local_1864;
  float *local_1818;
  int local_1810;
  float local_180c;
  int local_172c;
  int local_16dc;
  int local_16a8;
  int local_169c;
  float *local_1698;
  float *local_1690;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  int local_1644;
  float local_1640;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  int local_1624;
  float *local_1620;
  float local_1614;
  int local_1534;
  int local_14f4;
  float *local_1478;
  float *local_1470;
  int local_1468;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  int local_1424;
  float local_1420;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  int local_1404;
  float *local_1400;
  float local_13f4;
  int local_1304;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  
  iVar4 = (int)in_RSI[5];
  iVar2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) /
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  if (iVar4 == 1) {
    for (local_1304 = 0; local_1304 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_1304 = local_1304 + 1) {
      pfVar7 = (float *)(*in_RSI + (long)(local_1304 * iVar2) * in_RSI[2]);
      local_1470 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) +
                            (long)(local_1304 * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0));
      local_1478 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128) +
                            (long)(local_1304 * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x138));
      local_1418 = 0.0;
      fStack_1414 = 0.0;
      fStack_1410 = 0.0;
      fStack_140c = 0.0;
      local_1400 = pfVar7;
      for (local_1404 = 0; local_1404 + 3 < iVar2; local_1404 = local_1404 + 4) {
        local_1158 = (float)*(undefined8 *)local_1400;
        fStack_1154 = (float)((ulong)*(undefined8 *)local_1400 >> 0x20);
        fStack_1150 = (float)*(undefined8 *)(local_1400 + 2);
        fStack_114c = (float)((ulong)*(undefined8 *)(local_1400 + 2) >> 0x20);
        local_1418 = local_1418 + local_1158;
        fStack_1414 = fStack_1414 + fStack_1154;
        fStack_1410 = fStack_1410 + fStack_1150;
        fStack_140c = fStack_140c + fStack_114c;
        local_1400 = local_1400 + 4;
      }
      local_13f4 = local_1418 + fStack_1410 + fStack_1414 + fStack_140c + 0.0;
      for (; local_1404 < iVar2; local_1404 = local_1404 + 1) {
        local_13f4 = *local_1400 + local_13f4;
        local_1400 = local_1400 + 1;
      }
      local_13f4 = local_13f4 / (float)iVar2;
      local_1438 = 0.0;
      fStack_1434 = 0.0;
      fStack_1430 = 0.0;
      fStack_142c = 0.0;
      local_1400 = pfVar7;
      for (local_1424 = 0; local_1424 + 3 < iVar2; local_1424 = local_1424 + 4) {
        local_cf8 = (float)*(undefined8 *)local_1400;
        fStack_cf4 = (float)((ulong)*(undefined8 *)local_1400 >> 0x20);
        fStack_cf0 = (float)*(undefined8 *)(local_1400 + 2);
        fStack_cec = (float)((ulong)*(undefined8 *)(local_1400 + 2) >> 0x20);
        local_1438 = (local_cf8 - local_13f4) * (local_cf8 - local_13f4) + local_1438;
        fStack_1434 = (fStack_cf4 - local_13f4) * (fStack_cf4 - local_13f4) + fStack_1434;
        fStack_1430 = (fStack_cf0 - local_13f4) * (fStack_cf0 - local_13f4) + fStack_1430;
        fStack_142c = (fStack_cec - local_13f4) * (fStack_cec - local_13f4) + fStack_142c;
        local_1400 = local_1400 + 4;
      }
      local_1420 = local_1438 + fStack_1430 + fStack_1434 + fStack_142c + 0.0;
      for (; local_1424 < iVar2; local_1424 = local_1424 + 1) {
        local_1420 = (*local_1400 - local_13f4) * (*local_1400 - local_13f4) + local_1420;
        local_1400 = local_1400 + 1;
      }
      fVar8 = 1.0 / SQRT(local_1420 / (float)iVar2 +
                         *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
      fVar9 = -local_13f4 * fVar8;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        local_1400 = pfVar7;
        for (local_14f4 = 0; local_14f4 + 3 < iVar2; local_14f4 = local_14f4 + 4) {
          local_a08 = (float)*(undefined8 *)local_1400;
          fStack_a04 = (float)((ulong)*(undefined8 *)local_1400 >> 0x20);
          fStack_a00 = (float)*(undefined8 *)(local_1400 + 2);
          fStack_9fc = (float)((ulong)*(undefined8 *)(local_1400 + 2) >> 0x20);
          *(ulong *)local_1400 = CONCAT44(fStack_a04 * fVar8 + fVar9,local_a08 * fVar8 + fVar9);
          *(ulong *)(local_1400 + 2) =
               CONCAT44(fStack_9fc * fVar8 + fVar9,fStack_a00 * fVar8 + fVar9);
          local_1400 = local_1400 + 4;
        }
        for (; local_14f4 < iVar2; local_14f4 = local_14f4 + 1) {
          *local_1400 = *local_1400 * fVar8 + fVar9;
          local_1400 = local_1400 + 1;
        }
      }
      else {
        local_1400 = pfVar7;
        for (local_1468 = 0; local_1468 + 3 < iVar2; local_1468 = local_1468 + 4) {
          local_948 = (float)*(undefined8 *)local_1470;
          fStack_944 = (float)((ulong)*(undefined8 *)local_1470 >> 0x20);
          fStack_940 = (float)*(undefined8 *)(local_1470 + 2);
          fStack_93c = (float)((ulong)*(undefined8 *)(local_1470 + 2) >> 0x20);
          local_b08 = (float)*(undefined8 *)local_1478;
          fStack_b04 = (float)((ulong)*(undefined8 *)local_1478 >> 0x20);
          fStack_b00 = (float)*(undefined8 *)(local_1478 + 2);
          fStack_afc = (float)((ulong)*(undefined8 *)(local_1478 + 2) >> 0x20);
          local_a28 = (float)*(undefined8 *)local_1400;
          fStack_a24 = (float)((ulong)*(undefined8 *)local_1400 >> 0x20);
          fStack_a20 = (float)*(undefined8 *)(local_1400 + 2);
          fStack_a1c = (float)((ulong)*(undefined8 *)(local_1400 + 2) >> 0x20);
          *(ulong *)local_1400 =
               CONCAT44(fStack_a24 * fStack_944 * fVar8 + fStack_944 * fVar9 + fStack_b04,
                        local_a28 * local_948 * fVar8 + local_948 * fVar9 + local_b08);
          *(ulong *)(local_1400 + 2) =
               CONCAT44(fStack_a1c * fStack_93c * fVar8 + fStack_93c * fVar9 + fStack_afc,
                        fStack_a20 * fStack_940 * fVar8 + fStack_940 * fVar9 + fStack_b00);
          local_1470 = local_1470 + 4;
          local_1478 = local_1478 + 4;
          local_1400 = local_1400 + 4;
        }
        for (; local_1468 < iVar2; local_1468 = local_1468 + 1) {
          *local_1400 = *local_1400 * *local_1470 * fVar8 + *local_1470 * fVar9 + *local_1478;
          local_1470 = local_1470 + 1;
          local_1478 = local_1478 + 1;
          local_1400 = local_1400 + 1;
        }
      }
    }
  }
  else if (iVar4 == 2) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    iVar3 = iVar2 * iVar4;
    for (local_1534 = 0; local_1534 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_1534 = local_1534 + 1) {
      pfVar7 = (float *)(*in_RSI +
                        (long)*(int *)((long)in_RSI + 0x2c) * (long)(local_1534 * iVar2) * in_RSI[2]
                        );
      local_1690 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) +
                            (long)(local_1534 * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0));
      local_1698 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128) +
                            (long)(local_1534 * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x138));
      local_1638 = 0.0;
      fStack_1634 = 0.0;
      fStack_1630 = 0.0;
      fStack_162c = 0.0;
      local_1620 = pfVar7;
      for (local_1624 = 0; local_1624 + 3 < iVar3; local_1624 = local_1624 + 4) {
        local_1178 = (float)*(undefined8 *)local_1620;
        fStack_1174 = (float)((ulong)*(undefined8 *)local_1620 >> 0x20);
        fStack_1170 = (float)*(undefined8 *)(local_1620 + 2);
        fStack_116c = (float)((ulong)*(undefined8 *)(local_1620 + 2) >> 0x20);
        local_1638 = local_1638 + local_1178;
        fStack_1634 = fStack_1634 + fStack_1174;
        fStack_1630 = fStack_1630 + fStack_1170;
        fStack_162c = fStack_162c + fStack_116c;
        local_1620 = local_1620 + 4;
      }
      local_1614 = local_1638 + fStack_1630 + fStack_1634 + fStack_162c + 0.0;
      for (; local_1624 < iVar3; local_1624 = local_1624 + 1) {
        local_1614 = *local_1620 + local_1614;
        local_1620 = local_1620 + 1;
      }
      local_1614 = local_1614 / (float)iVar3;
      local_1658 = 0.0;
      fStack_1654 = 0.0;
      fStack_1650 = 0.0;
      fStack_164c = 0.0;
      local_1620 = pfVar7;
      for (local_1644 = 0; local_1644 + 3 < iVar3; local_1644 = local_1644 + 4) {
        local_d18 = (float)*(undefined8 *)local_1620;
        fStack_d14 = (float)((ulong)*(undefined8 *)local_1620 >> 0x20);
        fStack_d10 = (float)*(undefined8 *)(local_1620 + 2);
        fStack_d0c = (float)((ulong)*(undefined8 *)(local_1620 + 2) >> 0x20);
        local_1658 = (local_d18 - local_1614) * (local_d18 - local_1614) + local_1658;
        fStack_1654 = (fStack_d14 - local_1614) * (fStack_d14 - local_1614) + fStack_1654;
        fStack_1650 = (fStack_d10 - local_1614) * (fStack_d10 - local_1614) + fStack_1650;
        fStack_164c = (fStack_d0c - local_1614) * (fStack_d0c - local_1614) + fStack_164c;
        local_1620 = local_1620 + 4;
      }
      local_1640 = local_1658 + fStack_1650 + fStack_1654 + fStack_164c + 0.0;
      for (; local_1644 < iVar3; local_1644 = local_1644 + 1) {
        local_1640 = (*local_1620 - local_1614) * (*local_1620 - local_1614) + local_1640;
        local_1620 = local_1620 + 1;
      }
      fVar8 = 1.0 / SQRT(local_1640 / (float)iVar3 +
                         *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
      fVar9 = -local_1614 * fVar8;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        local_1620 = pfVar7;
        for (local_16dc = 0; local_16dc + 3 < iVar3; local_16dc = local_16dc + 4) {
          local_9a8 = (float)*(undefined8 *)local_1620;
          fStack_9a4 = (float)((ulong)*(undefined8 *)local_1620 >> 0x20);
          fStack_9a0 = (float)*(undefined8 *)(local_1620 + 2);
          fStack_99c = (float)((ulong)*(undefined8 *)(local_1620 + 2) >> 0x20);
          *(ulong *)local_1620 = CONCAT44(fStack_9a4 * fVar8 + fVar9,local_9a8 * fVar8 + fVar9);
          *(ulong *)(local_1620 + 2) =
               CONCAT44(fStack_99c * fVar8 + fVar9,fStack_9a0 * fVar8 + fVar9);
          local_1620 = local_1620 + 4;
        }
        for (; local_16dc < iVar3; local_16dc = local_16dc + 1) {
          *local_1620 = *local_1620 * fVar8 + fVar9;
          local_1620 = local_1620 + 1;
        }
      }
      else {
        local_1620 = pfVar7;
        for (local_169c = 0; local_169c < iVar2; local_169c = local_169c + 1) {
          fVar10 = *local_1690 * fVar8;
          fVar11 = *local_1690 * fVar9 + *local_1698;
          for (local_16a8 = 0; local_16a8 + 3 < iVar4; local_16a8 = local_16a8 + 4) {
            local_9c8 = (float)*(undefined8 *)local_1620;
            fStack_9c4 = (float)((ulong)*(undefined8 *)local_1620 >> 0x20);
            fStack_9c0 = (float)*(undefined8 *)(local_1620 + 2);
            fStack_9bc = (float)((ulong)*(undefined8 *)(local_1620 + 2) >> 0x20);
            *(ulong *)local_1620 =
                 CONCAT44(fStack_9c4 * fVar10 + fVar11,local_9c8 * fVar10 + fVar11);
            *(ulong *)(local_1620 + 2) =
                 CONCAT44(fStack_9bc * fVar10 + fVar11,fStack_9c0 * fVar10 + fVar11);
            local_1620 = local_1620 + 4;
          }
          for (; local_16a8 < iVar4; local_16a8 = local_16a8 + 1) {
            *local_1620 = *local_1620 * fVar10 + fVar11;
            local_1620 = local_1620 + 1;
          }
          local_1690 = local_1690 + 1;
          local_1698 = local_1698 + 1;
        }
      }
    }
  }
  else if ((iVar4 == 3) || (iVar4 == 4)) {
    iVar4 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
    for (local_172c = 0; local_172c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_172c = local_172c + 1) {
      lVar6 = *in_RSI + in_RSI[8] * (long)(local_172c * iVar2) * in_RSI[2];
      uVar1 = in_RSI[2];
      uVar5 = ((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
               (long)*(int *)((long)in_RSI + 0x34) * uVar1 + 0xf & 0xfffffffffffffff0) / uVar1;
      local_1930 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) +
                            (long)(local_172c * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0));
      local_1938 = (float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128) +
                            (long)(local_172c * iVar2) *
                            *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x138));
      local_180c = 0.0;
      for (local_1810 = 0; local_1810 < iVar2; local_1810 = local_1810 + 1) {
        local_1818 = (float *)(lVar6 + uVar5 * (long)local_1810 * uVar1);
        local_1878 = 0.0;
        fStack_1874 = 0.0;
        fStack_1870 = 0.0;
        fStack_186c = 0.0;
        for (local_1864 = 0; local_1864 + 3 < iVar4; local_1864 = local_1864 + 4) {
          local_1198 = (float)*(undefined8 *)local_1818;
          fStack_1194 = (float)((ulong)*(undefined8 *)local_1818 >> 0x20);
          fStack_1190 = (float)*(undefined8 *)(local_1818 + 2);
          fStack_118c = (float)((ulong)*(undefined8 *)(local_1818 + 2) >> 0x20);
          local_1878 = local_1878 + local_1198;
          fStack_1874 = fStack_1874 + fStack_1194;
          fStack_1870 = fStack_1870 + fStack_1190;
          fStack_186c = fStack_186c + fStack_118c;
          local_1818 = local_1818 + 4;
        }
        local_180c = local_1878 + fStack_1870 + fStack_1874 + fStack_186c + local_180c;
        for (; local_1864 < iVar4; local_1864 = local_1864 + 1) {
          local_180c = *local_1818 + local_180c;
          local_1818 = local_1818 + 1;
        }
      }
      local_180c = local_180c / (float)(iVar2 * iVar4);
      local_1880 = 0.0;
      for (local_1884 = 0; local_1884 < iVar2; local_1884 = local_1884 + 1) {
        local_1890 = (float *)(lVar6 + uVar5 * (long)local_1884 * uVar1);
        local_18f8 = 0.0;
        fStack_18f4 = 0.0;
        fStack_18f0 = 0.0;
        fStack_18ec = 0.0;
        for (local_18dc = 0; local_18dc + 3 < iVar4; local_18dc = local_18dc + 4) {
          local_d38 = (float)*(undefined8 *)local_1890;
          fStack_d34 = (float)((ulong)*(undefined8 *)local_1890 >> 0x20);
          fStack_d30 = (float)*(undefined8 *)(local_1890 + 2);
          fStack_d2c = (float)((ulong)*(undefined8 *)(local_1890 + 2) >> 0x20);
          local_18f8 = (local_d38 - local_180c) * (local_d38 - local_180c) + local_18f8;
          fStack_18f4 = (fStack_d34 - local_180c) * (fStack_d34 - local_180c) + fStack_18f4;
          fStack_18f0 = (fStack_d30 - local_180c) * (fStack_d30 - local_180c) + fStack_18f0;
          fStack_18ec = (fStack_d2c - local_180c) * (fStack_d2c - local_180c) + fStack_18ec;
          local_1890 = local_1890 + 4;
        }
        local_1880 = local_18f8 + fStack_18f0 + fStack_18f4 + fStack_18ec + local_1880;
        for (; local_18dc < iVar4; local_18dc = local_18dc + 1) {
          local_1880 = (*local_1890 - local_180c) * (*local_1890 - local_180c) + local_1880;
          local_1890 = local_1890 + 1;
        }
      }
      fVar8 = 1.0 / SQRT(local_1880 / (float)(iVar2 * iVar4) +
                         *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
      for (local_193c = 0; local_193c < iVar2; local_193c = local_193c + 1) {
        local_1944 = -local_180c * fVar8;
        local_1940 = fVar8;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 0) {
          local_1940 = *local_1930 * fVar8;
          local_1944 = *local_1930 * -local_180c * fVar8 + *local_1938;
        }
        local_1950 = (float *)(lVar6 + uVar5 * (long)local_193c * uVar1);
        for (local_199c = 0; local_199c + 3 < iVar4; local_199c = local_199c + 4) {
          local_968 = (float)*(undefined8 *)local_1950;
          fStack_964 = (float)((ulong)*(undefined8 *)local_1950 >> 0x20);
          fStack_960 = (float)*(undefined8 *)(local_1950 + 2);
          fStack_95c = (float)((ulong)*(undefined8 *)(local_1950 + 2) >> 0x20);
          *(ulong *)local_1950 =
               CONCAT44(fStack_964 * local_1940 + local_1944,local_968 * local_1940 + local_1944);
          *(ulong *)(local_1950 + 2) =
               CONCAT44(fStack_95c * local_1940 + local_1944,fStack_960 * local_1940 + local_1944);
          local_1950 = local_1950 + 4;
        }
        for (; local_199c < iVar4; local_199c = local_199c + 1) {
          *local_1950 = *local_1950 * local_1940 + local_1944;
          local_1950 = local_1950 + 1;
        }
        local_1930 = local_1930 + 1;
        local_1938 = local_1938 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}